

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_op.cc
# Opt level: O1

void absl::lts_20250127::log_internal::MakeCheckOpValueString(ostream *os,char v)

{
  undefined8 in_RAX;
  ostream *poVar1;
  undefined8 uStack_28;
  
  if ((byte)(v - 0x20U) < 0x5f) {
    uStack_28 = in_RAX;
    std::__ostream_insert<char,std::char_traits<char>>(os,"\'",1);
    uStack_28 = CONCAT17(v,(undefined7)uStack_28);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)((long)&uStack_28 + 7),1)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'",1);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"signed char value ",0x12);
  std::ostream::operator<<(os,(int)v);
  return;
}

Assistant:

void MakeCheckOpValueString(std::ostream& os, const signed char v) {
  if (v >= 32 && v <= 126) {
    os << "'" << v << "'";
  } else {
    os << "signed char value " << int{v};
  }
}